

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsStamp.cpp
# Opt level: O2

void __thiscall OpenMD::ZConsStamp::~ZConsStamp(ZConsStamp *this)

{
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ZConsStamp_00287f00;
  ParameterBase::~ParameterBase(&(this->CantVel).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->Kratio).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->Zpos).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->MolIndex).super_ParameterBase);
  DataHolder::~DataHolder(&this->super_DataHolder);
  return;
}

Assistant:

ZConsStamp::~ZConsStamp() {}